

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::test(FastText *this,istream *in,int32_t k)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  pointer ppVar7;
  vector<int,_std::allocator<int>_> labels;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> modelPredictions;
  vector<int,_std::allocator<int>_> line;
  vector<int,_std::allocator<int>_> local_a8;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_88;
  double local_68;
  undefined8 uStack_60;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uVar5 = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68 = 0.0;
  uStack_60 = 0;
  iVar6 = 0;
  while (iVar1 = std::istream::peek(), iVar1 != -1) {
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,&local_48,&local_a8,
                        &((this->model_).
                          super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         rng);
    Dictionary::addNgrams
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_48,
               ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->wordNgrams);
    if ((local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish !=
         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) &&
       (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start)) {
      local_88.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = uVar5;
      Model::predict((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_48,k,&local_88);
      ppVar7 = local_88.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        do {
          _Var2 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&ppVar7->second);
          local_68 = (double)((ulong)(_Var2._M_current ==
                                     local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish) * (long)local_68 +
                             (ulong)(_Var2._M_current !=
                                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish) * (long)(local_68 + 1.0));
          uStack_60 = 0;
          ppVar7 = ppVar7 + 1;
        } while (ppVar7 != local_88.
                           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar5 = (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar6 = iVar6 + 1;
      uVar5 = (ulong)(uint)((int)local_50 + (int)(uVar5 >> 2));
    }
  }
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P@",2);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  poVar3 = std::ostream::_M_insert<double>(local_68 / (double)(iVar6 * k));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R@",2);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  poVar3 = std::ostream::_M_insert<double>(local_68 / (double)(int)uVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of examples: ",0x14);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k) {
  int32_t nexamples = 0, nlabels = 0;
  double precision = 0.0;
  std::vector<int32_t> line, labels;

  while (in.peek() != EOF) {
    dict_->getLine(in, line, labels, model_->rng);
    dict_->addNgrams(line, args_->wordNgrams);
    if (labels.size() > 0 && line.size() > 0) {
      std::vector<std::pair<real, int32_t>> modelPredictions;
      model_->predict(line, k, modelPredictions);
      for (auto it = modelPredictions.cbegin(); it != modelPredictions.cend(); it++) {
        if (std::find(labels.begin(), labels.end(), it->second) != labels.end()) {
          precision += 1.0;
        }
      }
      nexamples++;
      nlabels += labels.size();
    }
  }
  std::cout << std::setprecision(3);
  std::cout << "P@" << k << ": " << precision / (k * nexamples) << std::endl;
  std::cout << "R@" << k << ": " << precision / nlabels << std::endl;
  std::cout << "Number of examples: " << nexamples << std::endl;
}